

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  __m128i *palVar7;
  int iVar8;
  int iVar9;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar10;
  __m128i *b_00;
  ulong uVar11;
  int iVar12;
  size_t len;
  ulong uVar13;
  __m128i *palVar14;
  uint uVar15;
  undefined8 extraout_RDX;
  long lVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong size;
  __m128i *ptr;
  uint uVar23;
  long lVar24;
  bool bVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i_64_t B_2;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  __m128i_64_t B_7;
  __m128i_64_t B_4;
  undefined1 auVar40 [16];
  long lVar42;
  undefined1 auVar41 [16];
  __m128i_64_t B;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint uVar51;
  uint uVar52;
  __m128i_64_t B_3;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uint uVar54;
  undefined1 auVar50 [16];
  undefined1 auVar56 [16];
  __m128i_64_t B_1;
  __m128i c;
  __m128i c_00;
  ulong local_b0;
  __m128i *local_90;
  ulong uStack_50;
  ulong uStack_40;
  longlong extraout_RDX_00;
  longlong lVar37;
  uint uVar53;
  uint uVar55;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar15 = profile->s1Len;
        if ((int)uVar15 < 1) {
          parasail_sw_table_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse41_128_64_cold_4();
        }
        else {
          local_b0 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_sse41_128_64_cold_1();
          }
          else {
            uVar11 = (ulong)uVar15 + 1;
            iVar8 = ppVar3->max;
            uVar23 = (uint)uVar11 & 0x7ffffffe;
            result = parasail_result_new_table1(uVar23,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar11 >> 1;
              result->flag = result->flag | 0x2820804;
              b = parasail_memalign___m128i(0x10,size);
              palVar10 = parasail_memalign___m128i(0x10,size);
              local_90 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_00 == (__m128i *)0x0 || local_90 == (__m128i *)0x0) ||
                           (palVar10 == (__m128i *)0x0 || b == (__m128i *)0x0);
              if ((b_00 != (__m128i *)0x0 && local_90 != (__m128i *)0x0) &&
                  (palVar10 != (__m128i *)0x0 && b != (__m128i *)0x0)) {
                len = 0x7fffffffffffffff;
                uVar26 = (ulong)(uint)gap;
                c[0] = size;
                parasail_memset___m128i(b,c,0x7fffffffffffffff);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                uStack_50 = (ulong)(uint)gap;
                uStack_40 = (ulong)(uint)open;
                iVar36 = (int)size;
                lVar16 = size * local_b0 * 4;
                lVar17 = -0x4000000000000000;
                lVar21 = 0;
                uVar18 = 0;
                uVar13 = 0;
                auVar38 = _DAT_00904f60;
                auVar46 = _DAT_00904f60;
                do {
                  ptr = b;
                  iVar12 = ppVar3->mapper[(byte)s2[uVar18]];
                  iVar9 = (int)uVar13;
                  palVar14 = local_90;
                  b = palVar10;
                  if (iVar9 == (int)uVar18 + -2) {
                    palVar14 = palVar10;
                    b = local_90;
                  }
                  lVar37 = ptr[iVar36 - 1][0];
                  lVar22 = 0;
                  lVar20 = 0;
                  auVar40 = (undefined1  [16])0x0;
                  lVar24 = lVar21;
                  do {
                    plVar1 = (long *)((long)pvVar2 + lVar20 + (long)iVar12 * (long)iVar36 * 0x10);
                    auVar34._0_8_ = lVar22 + *plVar1;
                    auVar34._8_8_ = lVar37 + plVar1[1];
                    auVar44 = *(undefined1 (*) [16])((long)*b_00 + lVar20);
                    auVar47._0_8_ = -(ulong)(auVar44._0_8_ < auVar34._0_8_);
                    auVar47._8_8_ = -(ulong)(auVar44._8_8_ < auVar34._8_8_);
                    auVar47 = blendvpd(auVar44,auVar34,auVar47);
                    auVar27._0_8_ = -(ulong)(auVar40._0_8_ < auVar47._0_8_);
                    auVar27._8_8_ = -(ulong)(auVar40._8_8_ < auVar47._8_8_);
                    auVar47 = blendvpd(auVar40,auVar47,auVar27);
                    auVar48._0_8_ = -(ulong)(0 < auVar47._0_8_);
                    auVar48._8_8_ = -(ulong)(0 < auVar47._8_8_);
                    auVar48 = auVar48 & auVar47;
                    *(undefined1 (*) [16])((long)*b + lVar20) = auVar48;
                    piVar4 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar4 + lVar24) = auVar48._0_4_;
                    *(int *)((long)piVar4 + lVar16 + lVar24) = auVar48._8_4_;
                    auVar28._0_8_ = -(ulong)(auVar38._0_8_ < auVar48._0_8_);
                    auVar28._8_8_ = -(ulong)(auVar38._8_8_ < auVar48._8_8_);
                    auVar38 = blendvpd(auVar38,auVar48,auVar28);
                    auVar49._0_8_ = auVar48._0_8_ - (ulong)(uint)open;
                    auVar49._8_8_ = auVar48._8_8_ - uStack_40;
                    auVar43._0_8_ = auVar44._0_8_ - uVar26;
                    auVar43._8_8_ = auVar44._8_8_ - uStack_50;
                    auVar44._0_8_ = -(ulong)(auVar49._0_8_ < auVar43._0_8_);
                    auVar44._8_8_ = -(ulong)(auVar49._8_8_ < auVar43._8_8_);
                    auVar56._0_8_ = auVar40._0_8_ - uVar26;
                    auVar56._8_8_ = auVar40._8_8_ - uStack_50;
                    auVar35._0_8_ = -(ulong)(auVar49._0_8_ < auVar56._0_8_);
                    auVar35._8_8_ = -(ulong)(auVar49._8_8_ < auVar56._8_8_);
                    auVar40 = blendvpd(auVar49,auVar43,auVar44);
                    *(undefined1 (*) [16])((long)*b_00 + lVar20) = auVar40;
                    auVar40 = blendvpd(auVar49,auVar56,auVar35);
                    plVar1 = (long *)((long)*ptr + lVar20);
                    lVar22 = *plVar1;
                    lVar37 = plVar1[1];
                    lVar20 = lVar20 + 0x10;
                    lVar24 = lVar24 + local_b0 * 4;
                  } while (size << 4 != lVar20);
                  bVar25 = true;
                  do {
                    bVar19 = bVar25;
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = auVar40._0_8_;
                    auVar40 = auVar6 << 0x40;
                    lVar24 = 0;
                    lVar22 = lVar21;
                    do {
                      auVar44 = *(undefined1 (*) [16])((long)*b + lVar24);
                      auVar29._0_8_ = -(ulong)(auVar40._0_8_ < auVar44._0_8_);
                      lVar42 = auVar40._8_8_;
                      auVar29._8_8_ = -(ulong)(lVar42 < auVar44._8_8_);
                      auVar44 = blendvpd(auVar40,auVar44,auVar29);
                      *(undefined1 (*) [16])((long)*b + lVar24) = auVar44;
                      piVar4 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar4 + lVar22) = auVar44._0_4_;
                      lVar20 = (long)piVar4 + lVar22;
                      uVar5 = extractps(auVar44,2);
                      *(undefined8 *)(lVar16 + lVar20) = uVar5;
                      auVar30._0_8_ = -(ulong)(auVar38._0_8_ < auVar44._0_8_);
                      auVar30._8_8_ = -(ulong)(auVar38._8_8_ < auVar44._8_8_);
                      auVar38 = blendvpd(auVar38,auVar44,auVar30);
                      auVar45._0_8_ = auVar44._0_8_ - (ulong)(uint)open;
                      auVar45._8_8_ = auVar44._8_8_ - uStack_40;
                      auVar40._0_8_ = auVar40._0_8_ - uVar26;
                      auVar40._8_8_ = lVar42 - uStack_50;
                      auVar31._0_8_ = -(ulong)(auVar45._0_8_ < auVar40._0_8_);
                      auVar31._8_8_ = -(ulong)(auVar45._8_8_ < auVar40._8_8_);
                      iVar12 = movmskpd((int)lVar20,auVar31);
                      if (iVar12 == 0) goto LAB_006c4d31;
                      lVar24 = lVar24 + 0x10;
                      lVar22 = lVar22 + local_b0 * 4;
                    } while (size << 4 != lVar24);
                    bVar25 = false;
                  } while (bVar19);
LAB_006c4d31:
                  lVar22 = auVar38._0_8_;
                  lVar24 = auVar38._8_8_;
                  auVar32._0_8_ = -(ulong)(auVar46._0_8_ < lVar22);
                  auVar32._8_8_ = -(ulong)(auVar46._8_8_ < lVar24);
                  iVar12 = movmskpd(iVar12,auVar32);
                  if (iVar12 != 0) {
                    lVar17 = lVar24;
                    if (lVar24 < lVar22) {
                      lVar17 = lVar22;
                    }
                    if ((long)(~(long)iVar8 + 0x7fffffffffffffffU) < lVar17) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      local_b0 = uVar18;
                      goto LAB_006c4d91;
                    }
                    auVar46._8_4_ = (int)lVar17;
                    auVar46._0_8_ = lVar17;
                    auVar46._12_4_ = (int)((ulong)lVar17 >> 0x20);
                    uVar13 = uVar18 & 0xffffffff;
                  }
                  iVar9 = (int)uVar13;
                  uVar18 = uVar18 + 1;
                  lVar21 = lVar21 + 4;
                  palVar10 = ptr;
                  local_90 = palVar14;
                  if (uVar18 == local_b0) {
LAB_006c4d91:
                    if (lVar17 == 0x7fffffffffffffff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar8 = parasail_result_is_saturated(result);
                    palVar10 = palVar14;
                    if (iVar8 == 0) {
                      palVar7 = ptr;
                      if (iVar9 == (int)local_b0 + -2) {
                        palVar10 = ptr;
                        palVar7 = palVar14;
                      }
                      if (iVar9 == (int)local_b0 + -1) {
                        palVar10 = b;
                        b = palVar14;
                        palVar7 = ptr;
                      }
                      ptr = palVar7;
                      uVar15 = uVar15 - 1;
                      bVar25 = (uVar11 & 0x7ffffffe) == 0;
                      if (!bVar25) {
                        if (bVar25) {
                          uVar11 = 0;
                          do {
                            uVar23 = (uint)(uVar11 >> 1) & 0x7fffffff;
                            if ((int)uVar15 <= (int)uVar23) {
                              uVar23 = uVar15;
                            }
                            if ((*palVar10)[uVar11] == lVar17) {
                              uVar15 = uVar23;
                            }
                            uVar11 = uVar11 + 1;
                          } while ((int)uVar11 != 0);
                        }
                        else {
                          auVar38._4_4_ = uVar15;
                          auVar38._0_4_ = uVar15;
                          auVar38._8_8_ = 0;
                          auVar39._8_4_ = (int)lVar17;
                          auVar39._0_8_ = lVar17;
                          auVar39._12_4_ = (int)((ulong)lVar17 >> 0x20);
                          auVar41 = pmovsxbd(auVar40,0x100);
                          uVar11 = 0;
                          auVar46 = pmovsxbd(auVar45,0x2020202);
                          do {
                            auVar33._0_4_ = -(uint)((*palVar10)[uVar11] == lVar17);
                            lVar16 = -(ulong)((*palVar10 + uVar11)[1] == auVar39._8_8_);
                            auVar33._8_4_ = (undefined4)lVar16;
                            auVar33._12_4_ = (undefined4)((ulong)lVar16 >> 0x20);
                            auVar33._4_4_ = auVar33._8_4_;
                            uVar15 = auVar41._0_4_ >> 1;
                            uVar51 = auVar41._4_4_;
                            uVar53 = auVar41._8_4_;
                            uVar55 = auVar41._12_4_;
                            uVar52 = uVar53 >> 1;
                            uVar54 = uVar55 >> 1;
                            iVar12 = (uVar51 >> 1) + iVar36;
                            iVar8 = auVar38._0_4_;
                            auVar50._0_4_ =
                                 (uint)(iVar8 < (int)uVar15) * iVar8 |
                                 (iVar8 >= (int)uVar15) * uVar15;
                            iVar8 = auVar38._4_4_;
                            auVar50._4_4_ =
                                 (uint)(iVar8 < iVar12) * iVar8 | (uint)(iVar8 >= iVar12) * iVar12;
                            iVar8 = auVar38._8_4_;
                            auVar50._8_4_ =
                                 (uint)(iVar8 < (int)uVar52) * iVar8 |
                                 (iVar8 >= (int)uVar52) * uVar52;
                            iVar8 = auVar38._12_4_;
                            auVar50._12_4_ =
                                 (uint)(iVar8 < (int)uVar54) * iVar8 |
                                 (iVar8 >= (int)uVar54) * uVar54;
                            auVar38 = blendvps(auVar38,auVar50,auVar33);
                            uVar11 = uVar11 + 2;
                            auVar41._0_4_ = auVar41._0_4_ + auVar46._0_4_;
                            auVar41._4_4_ = uVar51 + auVar46._4_4_;
                            auVar41._8_4_ = uVar53 + auVar46._8_4_;
                            auVar41._12_4_ = uVar55 + auVar46._12_4_;
                          } while (uVar23 != uVar11);
                          iVar8 = auVar38._0_4_;
                          iVar36 = auVar38._4_4_;
                          uVar15 = (uint)(iVar8 < iVar36) * iVar8 | (uint)(iVar8 >= iVar36) * iVar36
                          ;
                        }
                      }
                    }
                    else {
                      iVar9 = 0;
                      lVar17 = 0xffffffff;
                      uVar15 = 0;
                    }
                    result->score = (int)lVar17;
                    result->end_query = uVar15;
                    result->end_ref = iVar9;
                    parasail_free(b_00);
                    parasail_free(palVar10);
                    parasail_free(ptr);
                    parasail_free(b);
                    return result;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int64_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}